

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkTopAnd(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *vRoots;
  Abc_Ntk_t *pNtk_00;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x29a,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
  }
  if (0 < pNtk->vPos->nSize) {
    plVar1 = (long *)*pNtk->vPos->pArray;
    vRoots = Abc_NodeGetSuper((Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                        (long)*(int *)plVar1[4] * 8)));
    if (1 < vRoots->nSize) {
      Abc_NtkCleanCopy(pNtk);
      pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      pcVar6 = Extra_UtilStrsav(pNtk->pName);
      pNtk_00->pName = pcVar6;
      pcVar6 = Extra_UtilStrsav(pNtk->pSpec);
      pNtk_00->pSpec = pcVar6;
      pAVar7 = Abc_AigConst1(pNtk_00);
      pAVar8 = Abc_AigConst1(pNtk);
      (pAVar8->field_6).pCopy = pAVar7;
      pVVar9 = pNtk->vPis;
      if (0 < pVVar9->nSize) {
        lVar10 = 0;
        do {
          Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar9->pArray[lVar10],1);
          lVar10 = lVar10 + 1;
          pVVar9 = pNtk->vPis;
        } while (lVar10 < pVVar9->nSize);
      }
      pVVar9 = Abc_NtkDfsIterNodes(pNtk,vRoots);
      if (0 < pVVar9->nSize) {
        lVar10 = 0;
        do {
          plVar1 = (long *)pVVar9->pArray[lVar10];
          lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40))
                             );
          plVar1[8] = (long)pAVar7;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar9->nSize);
      }
      if (pVVar9->pArray != (void **)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (void **)0x0;
      }
      if (pVVar9 != (Vec_Ptr_t *)0x0) {
        free(pVVar9);
      }
      if (0 < vRoots->nSize) {
        lVar10 = 0;
        do {
          pvVar3 = vRoots->pArray[lVar10];
          pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)
                                 ((ulong)((uint)pvVar3 & 1) ^
                                 *(ulong *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x40)));
          pcVar6 = Abc_ObjName(pAVar7);
          Abc_ObjAssignName(pAVar7,pcVar6,(char *)0x0);
          lVar10 = lVar10 + 1;
        } while (lVar10 < vRoots->nSize);
      }
      if (vRoots->pArray != (void **)0x0) {
        free(vRoots->pArray);
        vRoots->pArray = (void **)0x0;
      }
      if (vRoots != (Vec_Ptr_t *)0x0) {
        free(vRoots);
      }
      uVar4 = Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
      if (uVar4 != 0) {
        printf("Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar4);
      }
      iVar5 = Abc_NtkCheck(pNtk_00);
      if (iVar5 == 0) {
        puts("Abc_NtkStrash: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
    __assert_fail("Vec_PtrSize(vNodes) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x29e,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTopAnd( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vOrder;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj, * pDriver, * pObjPo;
    int i, nNodes;
    assert( Abc_NtkIsStrash(pNtk) );
    // get the first PO
    pObjPo = Abc_NtkPo(pNtk, 0);
    vNodes = Abc_NodeGetSuper( Abc_ObjChild0(pObjPo) );
    assert( Vec_PtrSize(vNodes) >= 2 );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    Abc_NtkCleanCopy( pNtk );
    pNtkAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkAig, pObj, 1 );
    // restrash the nodes reachable from the roots
    vOrder = Abc_NtkDfsIterNodes( pNtk, vNodes );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vOrder );
    // finalize the network
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo(pNtkAig);
        pDriver = Abc_ObjNotCond(Abc_ObjRegular(pObj)->pCopy, Abc_ObjIsComplement(pObj));
        Abc_ObjAddFanin( pObjPo, pDriver );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
    }
    Vec_PtrFree( vNodes );
    // perform cleanup if requested
    if ( (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}